

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O0

bool testing::internal::ParseGoogleMockFlag(char *str,char *flag_name,int32_t *value)

{
  Message *pMVar1;
  Message local_38;
  char *local_30;
  char *value_str;
  int32_t *value_local;
  char *flag_name_local;
  char *str_local;
  
  value_str = (char *)value;
  value_local = (int32_t *)flag_name;
  flag_name_local = str;
  local_30 = ParseGoogleMockFlagValue(str,flag_name,true);
  if (local_30 == (char *)0x0) {
    str_local._7_1_ = 0;
  }
  else {
    Message::Message(&local_38);
    pMVar1 = Message::operator<<(&local_38,(char (*) [21])"The value of flag --");
    pMVar1 = Message::operator<<(pMVar1,(char **)&value_local);
    str_local._7_1_ = ParseInt32(pMVar1,local_30,(int32_t *)value_str);
    Message::~Message(&local_38);
  }
  return (bool)(str_local._7_1_ & 1);
}

Assistant:

static bool ParseGoogleMockFlag(const char* str, const char* flag_name,
                                int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag_name, true);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag_name, value_str,
                    value);
}